

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

void __thiscall testing::internal::MutexBase::Unlock(MutexBase *this)

{
  ostream *poVar1;
  GTestLog local_18;
  int local_14;
  MutexBase *pMStack_10;
  int gtest_error;
  MutexBase *this_local;
  
  this->has_owner_ = false;
  pMStack_10 = this;
  local_14 = pthread_mutex_unlock((pthread_mutex_t *)this);
  if (local_14 != 0) {
    GTestLog::GTestLog(&local_18,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/nolanholden[P]cpp-mediator/gtest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x7b7);
    poVar1 = GTestLog::GetStream(&local_18);
    poVar1 = std::operator<<(poVar1,"pthread_mutex_unlock(&mutex_)");
    poVar1 = std::operator<<(poVar1,"failed with error ");
    std::ostream::operator<<(poVar1,local_14);
    GTestLog::~GTestLog(&local_18);
  }
  return;
}

Assistant:

void Unlock() {
    // Since the lock is being released the owner_ field should no longer be
    // considered valid. We don't protect writing to has_owner_ here, as it's
    // the caller's responsibility to ensure that the current thread holds the
    // mutex when this is called.
    has_owner_ = false;
    GTEST_CHECK_POSIX_SUCCESS_(pthread_mutex_unlock(&mutex_));
  }